

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

completion * __thiscall
mjs::interpreter::impl::operator()(completion *__return_storage_ptr__,impl *this,for_statement *s)

{
  pointer pbVar1;
  statement *s_00;
  expression *peVar2;
  bool bVar3;
  label_set ls;
  completion c;
  label_set local_118;
  value *local_f8;
  wstring_view *local_f0;
  completion local_e8;
  value local_a8;
  value local_80;
  value local_58;
  
  local_118.
  super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((for_statement *)this->labels_valid_for_ == s) {
    local_118.
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->label_set_).
         super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_118.
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->label_set_).
         super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_118.
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->label_set_).
         super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->label_set_).
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->label_set_).
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->label_set_).
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    pbVar1 = (this->label_set_).
             super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->label_set_).
        super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pbVar1) {
      (this->label_set_).
      super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
    }
  }
  this->labels_valid_for_ = (statement *)0x0;
  s_00 = (s->init_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
         ._M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
         super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  if (s_00 != (statement *)0x0) {
    eval(&local_e8,this,s_00);
    if (local_e8.type != normal) {
      __assert_fail("!c",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                    ,0x3bf,"completion mjs::interpreter::impl::operator()(const for_statement &)");
    }
    get_value(&local_80,this,&local_e8.result);
    value::destroy(&local_80);
    value::destroy(&local_e8.result);
  }
  completion::completion(__return_storage_ptr__,(value *)&value::undefined,normal);
  local_f8 = &__return_storage_ptr__->result;
  local_f0 = &__return_storage_ptr__->target;
  do {
    peVar2 = (s->cond_)._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
    if (peVar2 != (expression *)0x0) {
      eval(&local_a8,this,peVar2);
      get_value((value *)&local_e8,this,&local_a8);
      bVar3 = to_boolean((value *)&local_e8);
      value::destroy((value *)&local_e8);
      value::destroy(&local_a8);
      if (!bVar3) {
LAB_0011e1f2:
        if (local_118.
            super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.
                          super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_118.
                                super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.
                                super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        return __return_storage_ptr__;
      }
    }
    eval(&local_e8,this,
         (s->s_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
         _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
         super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl);
    __return_storage_ptr__->type = local_e8.type;
    value::operator=(local_f8,&local_e8.result);
    local_f0->_M_len = local_e8.target._M_len;
    local_f0->_M_str = local_e8.target._M_str;
    value::destroy(&local_e8.result);
    bVar3 = handle_completion(__return_storage_ptr__,&local_118);
    if (bVar3) goto LAB_0011e1f2;
    peVar2 = (s->iter_)._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
    if (peVar2 != (expression *)0x0) {
      eval((value *)&local_e8,this,peVar2);
      get_value(&local_58,this,(value *)&local_e8);
      value::destroy(&local_58);
      value::destroy((value *)&local_e8);
    }
  } while( true );
}

Assistant:

completion operator()(const for_statement& s) {
        const auto ls = get_labels(s);
        if (auto is = s.init()) {
            auto c = eval(*is);
            assert(!c); // Expect normal completion
            (void)get_value(c.result);
        }
        completion c{};
        while (!s.cond() || to_boolean(get_value(eval(*s.cond())))) {
            c = eval(s.s());

            if (handle_completion(c, ls)) {
                return c;
            }

            if (s.iter()) {
                (void)get_value(eval(*s.iter()));
            }
        }
        return c;
    }